

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktGeometryBasicGeometryShaderTests.cpp
# Opt level: O1

Move<vk::Handle<(vk::HandleType)16>_> * __thiscall
vkt::geometry::anon_unknown_0::VaryingOutputCountTestInstance::createPipelineLayout
          (Move<vk::Handle<(vk::HandleType)16>_> *__return_storage_ptr__,
          VaryingOutputCountTestInstance *this,DeviceInterface *vk,VkDevice device)

{
  Move<vk::Handle<(vk::HandleType)9>_> *pMVar1;
  Move<vk::Handle<(vk::HandleType)19>_> *pMVar2;
  VkDescriptorPool VVar3;
  deUint64 dVar4;
  VkImage obj;
  Allocation *pAVar5;
  Context *this_00;
  TextureFormat TVar6;
  void *pvVar7;
  undefined8 uVar8;
  TextureFormat TVar9;
  TextureFormat TVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  VkFormat VVar17;
  VkResult VVar18;
  deUint32 queueFamilyIndex;
  int iVar19;
  DescriptorSetLayoutBuilder *pDVar20;
  DescriptorPoolBuilder *pDVar21;
  Allocator *pAVar22;
  DeviceInterface *pDVar23;
  VkDevice device_00;
  VkQueue pVVar24;
  VkDescriptorSetLayout VVar25;
  Vec4 *color;
  long lVar26;
  ulong size;
  VkImageMemoryBarrier postImageBarrier;
  VkImageMemoryBarrier preImageBarrier;
  Move<vk::VkCommandBuffer_s_*> cmdBuffer;
  PixelBufferAccess destAccess;
  Move<vk::Handle<(vk::HandleType)8>_> buffer;
  Move<vk::Handle<(vk::HandleType)6>_> fence;
  Move<vk::Handle<(vk::HandleType)24>_> cmdPool;
  VkImageCreateInfo imageParams;
  VkBufferImageCopy copyRegions;
  TextureLevel texture;
  VkBufferMemoryBarrier preBufferBarrier;
  undefined1 local_c8 [20];
  undefined4 local_b4;
  undefined8 local_b0;
  undefined8 uStack_a8;
  undefined4 local_a0;
  undefined8 local_9c;
  undefined8 uStack_94;
  undefined4 local_8c;
  PixelBufferAccess local_88;
  TextureFormat texFormat;
  VkCommandBufferBeginInfo cmdBufferBeginInfo;
  
  if (this->m_test == READ_TEXTURE) {
    local_c8._0_4_ = 255.0;
    local_c8._4_4_ = 0.0;
    local_c8._8_4_ = 0.0;
    local_c8._12_8_ = 0;
    local_b4 = 0x437f0000;
    local_b0 = 0;
    uStack_a8 = 0;
    local_a0 = 0x437f0000;
    local_9c = 0;
    uStack_94 = 0;
    local_8c = 0x437f0000;
    texFormat = glu::mapGLInternalFormat(0x8058);
    VVar17 = ::vk::mapTextureFormat(&texFormat);
    pAVar22 = Context::getDefaultAllocator
                        ((this->super_GeometryExpanderRenderTestInstance).super_TestInstance.
                         m_context);
    tcu::TextureLevel::TextureLevel(&texture,&texFormat,4,1,1);
    tcu::TextureLevel::getAccess((PixelBufferAccess *)&imageParams,&texture);
    if (0 < texture.m_size.m_data[0]) {
      color = (Vec4 *)local_c8;
      lVar26 = 0;
      do {
        tcu::PixelBufferAccess::setPixel((PixelBufferAccess *)&imageParams,color,(int)lVar26,0,0);
        lVar26 = lVar26 + 1;
        color = color + 1;
      } while (lVar26 < texture.m_size.m_data[0]);
    }
    imageParams.sType = VK_STRUCTURE_TYPE_IMAGE_CREATE_INFO;
    imageParams.pNext = (void *)0x0;
    imageParams.flags = 0;
    imageParams.imageType = VK_IMAGE_TYPE_2D;
    imageParams.extent.width = 4;
    imageParams.extent.height = 1;
    imageParams.extent.depth = 1;
    imageParams.mipLevels = 1;
    imageParams.arrayLayers = 1;
    imageParams.samples = VK_SAMPLE_COUNT_1_BIT;
    imageParams.tiling = VK_IMAGE_TILING_OPTIMAL;
    imageParams.usage = 6;
    imageParams.sharingMode = VK_SHARING_MODE_EXCLUSIVE;
    imageParams.queueFamilyIndexCount = 0;
    imageParams.pQueueFamilyIndices = (deUint32 *)0x0;
    imageParams.initialLayout = VK_IMAGE_LAYOUT_UNDEFINED;
    imageParams.format = VVar17;
    ::vk::createImage((Move<vk::Handle<(vk::HandleType)9>_> *)&postImageBarrier,vk,device,
                      &imageParams,(VkAllocationCallbacks *)0x0);
    preImageBarrier.srcAccessMask = postImageBarrier.srcAccessMask;
    preImageBarrier.dstAccessMask = postImageBarrier.dstAccessMask;
    preImageBarrier.oldLayout = postImageBarrier.oldLayout;
    preImageBarrier.newLayout = postImageBarrier.newLayout;
    preImageBarrier.sType = postImageBarrier.sType;
    preImageBarrier._4_4_ = postImageBarrier._4_4_;
    preImageBarrier.pNext = postImageBarrier.pNext;
    postImageBarrier.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
    postImageBarrier._4_4_ = 0;
    postImageBarrier.pNext = (void *)0x0;
    postImageBarrier.srcAccessMask = 0;
    postImageBarrier.dstAccessMask = 0;
    postImageBarrier.oldLayout = VK_IMAGE_LAYOUT_UNDEFINED;
    postImageBarrier.newLayout = VK_IMAGE_LAYOUT_UNDEFINED;
    obj.m_internal =
         (this->m_texture).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal;
    if (obj.m_internal != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)9>_>::operator()
                (&(this->m_texture).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter,obj
                );
    }
    pMVar1 = &this->m_texture;
    (this->m_texture).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_device =
         (VkDevice)preImageBarrier._16_8_;
    (this->m_texture).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_allocator =
         (VkAllocationCallbacks *)preImageBarrier._24_8_;
    (pMVar1->super_RefBase<vk::Handle<(vk::HandleType)9>_>).m_data.object.m_internal =
         preImageBarrier._0_8_;
    (this->m_texture).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_deviceIface =
         (DeviceInterface *)preImageBarrier.pNext;
    if (postImageBarrier._0_8_ != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)9>_>::operator()
                ((Deleter<vk::Handle<(vk::HandleType)9>_> *)&postImageBarrier.pNext,
                 (VkImage)postImageBarrier._0_8_);
    }
    ::vk::getImageMemoryRequirements
              ((VkMemoryRequirements *)&preImageBarrier,vk,device,
               (VkImage)(pMVar1->super_RefBase<vk::Handle<(vk::HandleType)9>_>).m_data.object.
                        m_internal);
    (*pAVar22->_vptr_Allocator[3])(&postImageBarrier,pAVar22,&preImageBarrier,0);
    uVar8 = postImageBarrier._0_8_;
    postImageBarrier.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
    postImageBarrier._4_4_ = 0;
    pAVar5 = (this->m_allocation).
             super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
    if (pAVar5 != (Allocation *)uVar8) {
      if (pAVar5 != (Allocation *)0x0) {
        (*pAVar5->_vptr_Allocation[1])();
        (this->m_allocation).super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
        m_data.ptr = (Allocation *)0x0;
      }
      (this->m_allocation).super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
      m_data.ptr = (Allocation *)uVar8;
    }
    if (postImageBarrier._0_8_ != 0) {
      (**(code **)(*(long *)postImageBarrier._0_8_ + 8))();
      postImageBarrier.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
      postImageBarrier._4_4_ = 0;
    }
    VVar18 = (*vk->_vptr_DeviceInterface[0xd])
                       (vk,device,
                        (this->m_texture).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.
                        object.m_internal,
                        (((this->m_allocation).
                          super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
                          m_data.ptr)->m_memory).m_internal);
    ::vk::checkResult(VVar18,
                      "vk.bindImageMemory(device, *m_texture, m_allocation->getMemory(), m_allocation->getOffset())"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/geometry/vktGeometryBasicGeometryShaderTests.cpp"
                      ,0x199);
    this_00 = (this->super_GeometryExpanderRenderTestInstance).super_TestInstance.m_context;
    tcu::TextureLevel::getAccess(&local_88,&texture);
    dVar4 = (pMVar1->super_RefBase<vk::Handle<(vk::HandleType)9>_>).m_data.object.m_internal;
    pDVar23 = Context::getDeviceInterface(this_00);
    device_00 = Context::getDevice(this_00);
    queueFamilyIndex = Context::getUniversalQueueFamilyIndex(this_00);
    pVVar24 = Context::getUniversalQueue(this_00);
    pAVar22 = Context::getDefaultAllocator(this_00);
    iVar16 = local_88.super_ConstPixelBufferAccess.m_size.m_data[2];
    iVar15 = local_88.super_ConstPixelBufferAccess.m_size.m_data[1];
    iVar14 = local_88.super_ConstPixelBufferAccess.m_size.m_data[0];
    iVar19 = tcu::TextureFormat::getPixelSize((TextureFormat *)&local_88);
    size = (ulong)(uint)(iVar16 * iVar19 * iVar15 * iVar14);
    buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device = (VkDevice)0x0;
    buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator =
         (VkAllocationCallbacks *)0x0;
    buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal = 0;
    buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface =
         (DeviceInterface *)0x0;
    cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_device = (VkDevice)0x0;
    cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator =
         (VkAllocationCallbacks *)0x0;
    cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal = 0;
    cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_deviceIface =
         (DeviceInterface *)0x0;
    fence.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.m_device = (VkDevice)0x0;
    fence.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.m_allocator =
         (VkAllocationCallbacks *)0x0;
    fence.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.object.m_internal = 0;
    fence.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.m_deviceIface =
         (DeviceInterface *)0x0;
    preImageBarrier.sType = VK_STRUCTURE_TYPE_BUFFER_CREATE_INFO;
    preImageBarrier.pNext = (void *)0x0;
    preImageBarrier._16_8_ = preImageBarrier._16_8_ & 0xffffffff00000000;
    preImageBarrier.srcQueueFamilyIndex = 1;
    preImageBarrier.dstQueueFamilyIndex = 0;
    preImageBarrier.image.m_internal = (ulong)preImageBarrier.image.m_internal._4_4_ << 0x20;
    preImageBarrier.subresourceRange.aspectMask = 0;
    preImageBarrier.subresourceRange.baseMipLevel = 0;
    preImageBarrier._24_8_ = size;
    ::vk::createBuffer((Move<vk::Handle<(vk::HandleType)8>_> *)&destAccess,pDVar23,device_00,
                       (VkBufferCreateInfo *)&preImageBarrier,(VkAllocationCallbacks *)0x0);
    postImageBarrier.srcAccessMask = destAccess.super_ConstPixelBufferAccess.m_size.m_data[2];
    postImageBarrier.dstAccessMask = destAccess.super_ConstPixelBufferAccess.m_pitch.m_data[0];
    postImageBarrier.oldLayout = destAccess.super_ConstPixelBufferAccess.m_pitch.m_data[1];
    postImageBarrier.newLayout = destAccess.super_ConstPixelBufferAccess.m_pitch.m_data[2];
    postImageBarrier.sType = destAccess.super_ConstPixelBufferAccess.m_format.order;
    postImageBarrier._4_4_ = destAccess.super_ConstPixelBufferAccess.m_format.type;
    postImageBarrier.pNext = (void *)destAccess.super_ConstPixelBufferAccess.m_size.m_data._0_8_;
    destAccess.super_ConstPixelBufferAccess.m_format.order = R;
    destAccess.super_ConstPixelBufferAccess.m_format.type = SNORM_INT8;
    destAccess.super_ConstPixelBufferAccess.m_size.m_data[0] = 0;
    destAccess.super_ConstPixelBufferAccess.m_size.m_data[1] = 0;
    destAccess.super_ConstPixelBufferAccess.m_size.m_data[2] = 0;
    destAccess.super_ConstPixelBufferAccess.m_pitch.m_data[0] = 0;
    destAccess.super_ConstPixelBufferAccess.m_pitch.m_data[1] = 0;
    destAccess.super_ConstPixelBufferAccess.m_pitch.m_data[2] = 0;
    if (buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
                (&buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter,
                 (VkBuffer)
                 buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal);
    }
    buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device =
         (VkDevice)postImageBarrier._16_8_;
    buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator =
         (VkAllocationCallbacks *)postImageBarrier._24_8_;
    buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal =
         postImageBarrier._0_8_;
    buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface =
         (DeviceInterface *)postImageBarrier.pNext;
    if (destAccess.super_ConstPixelBufferAccess.m_format != (TextureFormat)0x0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
                ((Deleter<vk::Handle<(vk::HandleType)8>_> *)
                 &destAccess.super_ConstPixelBufferAccess.m_size,
                 (VkBuffer)destAccess.super_ConstPixelBufferAccess.m_format);
    }
    ::vk::getBufferMemoryRequirements
              ((VkMemoryRequirements *)&postImageBarrier,pDVar23,device_00,
               (VkBuffer)
               buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal);
    (*pAVar22->_vptr_Allocator[3])(&destAccess,pAVar22,&postImageBarrier,1);
    TVar6 = destAccess.super_ConstPixelBufferAccess.m_format;
    VVar18 = (*pDVar23->_vptr_DeviceInterface[0xc])
                       (pDVar23,device_00,
                        buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
                        m_internal,
                        *(undefined8 *)((long)destAccess.super_ConstPixelBufferAccess.m_format + 8),
                        *(undefined8 *)
                         ((long)destAccess.super_ConstPixelBufferAccess.m_format + 0x10));
    ::vk::checkResult(VVar18,
                      "vk.bindBufferMemory(device, *buffer, bufferAlloc->getMemory(), bufferAlloc->getOffset())"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/geometry/vktGeometryBasicGeometryShaderTests.cpp"
                      ,0x7a);
    ::vk::createCommandPool
              ((Move<vk::Handle<(vk::HandleType)24>_> *)&postImageBarrier,pDVar23,device_00,1,
               queueFamilyIndex,(VkAllocationCallbacks *)0x0);
    preImageBarrier.srcAccessMask = postImageBarrier.srcAccessMask;
    preImageBarrier.dstAccessMask = postImageBarrier.dstAccessMask;
    preImageBarrier.oldLayout = postImageBarrier.oldLayout;
    preImageBarrier.newLayout = postImageBarrier.newLayout;
    preImageBarrier.sType = postImageBarrier.sType;
    preImageBarrier._4_4_ = postImageBarrier._4_4_;
    preImageBarrier.pNext = postImageBarrier.pNext;
    postImageBarrier.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
    postImageBarrier._4_4_ = 0;
    postImageBarrier.pNext = (void *)0x0;
    postImageBarrier.srcAccessMask = 0;
    postImageBarrier.dstAccessMask = 0;
    postImageBarrier.oldLayout = VK_IMAGE_LAYOUT_UNDEFINED;
    postImageBarrier.newLayout = VK_IMAGE_LAYOUT_UNDEFINED;
    if (cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)24>_>::operator()
                (&cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter,
                 (VkCommandPool)
                 cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal);
    }
    cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_device =
         (VkDevice)preImageBarrier._16_8_;
    cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator =
         (VkAllocationCallbacks *)preImageBarrier._24_8_;
    cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal =
         preImageBarrier._0_8_;
    cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_deviceIface =
         (DeviceInterface *)preImageBarrier.pNext;
    if (postImageBarrier._0_8_ != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)24>_>::operator()
                ((Deleter<vk::Handle<(vk::HandleType)24>_> *)&postImageBarrier.pNext,
                 (VkCommandPool)postImageBarrier._0_8_);
    }
    postImageBarrier.sType = VK_STRUCTURE_TYPE_COMMAND_BUFFER_ALLOCATE_INFO;
    postImageBarrier.pNext = (void *)0x0;
    postImageBarrier.srcAccessMask =
         (undefined4)cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal
    ;
    postImageBarrier.dstAccessMask =
         cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal._4_4_;
    postImageBarrier.oldLayout = VK_IMAGE_LAYOUT_UNDEFINED;
    postImageBarrier.newLayout = VK_IMAGE_LAYOUT_GENERAL;
    ::vk::allocateCommandBuffer
              ((Move<vk::VkCommandBuffer_s_*> *)&destAccess,pDVar23,device_00,
               (VkCommandBufferAllocateInfo *)&postImageBarrier);
    uVar13 = destAccess.super_ConstPixelBufferAccess.m_pitch.m_data._4_8_;
    uVar12 = destAccess.super_ConstPixelBufferAccess._16_8_;
    uVar11 = destAccess.super_ConstPixelBufferAccess.m_size.m_data._0_8_;
    TVar9 = destAccess.super_ConstPixelBufferAccess.m_format;
    preImageBarrier.srcAccessMask = destAccess.super_ConstPixelBufferAccess.m_size.m_data[2];
    preImageBarrier.oldLayout = destAccess.super_ConstPixelBufferAccess.m_pitch.m_data[1];
    preImageBarrier.sType = destAccess.super_ConstPixelBufferAccess.m_format.order;
    preImageBarrier._4_4_ = destAccess.super_ConstPixelBufferAccess.m_format.type;
    uVar8 = preImageBarrier._0_8_;
    preImageBarrier.newLayout = destAccess.super_ConstPixelBufferAccess.m_pitch.m_data[2];
    preImageBarrier.dstAccessMask = destAccess.super_ConstPixelBufferAccess.m_pitch.m_data[0];
    destAccess.super_ConstPixelBufferAccess.m_pitch.m_data[1] = 0;
    destAccess.super_ConstPixelBufferAccess.m_pitch.m_data[2] = 0;
    destAccess.super_ConstPixelBufferAccess.m_size.m_data[2] = 0;
    destAccess.super_ConstPixelBufferAccess.m_pitch.m_data[0] = 0;
    destAccess.super_ConstPixelBufferAccess.m_size.m_data[0] = 0;
    destAccess.super_ConstPixelBufferAccess.m_size.m_data[1] = 0;
    destAccess.super_ConstPixelBufferAccess.m_format.order = R;
    destAccess.super_ConstPixelBufferAccess.m_format.type = SNORM_INT8;
    TVar10 = destAccess.super_ConstPixelBufferAccess.m_format;
    preImageBarrier.pNext = (void *)uVar11;
    destAccess.super_ConstPixelBufferAccess.m_format.order = TVar9.order;
    destAccess.super_ConstPixelBufferAccess.m_format.type = TVar9.type;
    preImageBarrier.sType = destAccess.super_ConstPixelBufferAccess.m_format.order;
    preImageBarrier._4_4_ = destAccess.super_ConstPixelBufferAccess.m_format.type;
    destAccess.super_ConstPixelBufferAccess.m_format = TVar10;
    ::vk::createFence((Move<vk::Handle<(vk::HandleType)6>_> *)&postImageBarrier,pDVar23,device_00,0,
                      (VkAllocationCallbacks *)0x0);
    preImageBarrier.srcAccessMask = postImageBarrier.srcAccessMask;
    preImageBarrier.dstAccessMask = postImageBarrier.dstAccessMask;
    preImageBarrier.oldLayout = postImageBarrier.oldLayout;
    preImageBarrier.newLayout = postImageBarrier.newLayout;
    preImageBarrier.sType = postImageBarrier.sType;
    preImageBarrier._4_4_ = postImageBarrier._4_4_;
    preImageBarrier.pNext = postImageBarrier.pNext;
    postImageBarrier.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
    postImageBarrier._4_4_ = 0;
    postImageBarrier.pNext = (void *)0x0;
    postImageBarrier.srcAccessMask = 0;
    postImageBarrier.dstAccessMask = 0;
    postImageBarrier.oldLayout = VK_IMAGE_LAYOUT_UNDEFINED;
    postImageBarrier.newLayout = VK_IMAGE_LAYOUT_UNDEFINED;
    if (fence.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.object.m_internal != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)6>_>::operator()
                (&fence.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter,
                 (VkFence)fence.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.object.
                          m_internal);
    }
    fence.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.m_device =
         (VkDevice)preImageBarrier._16_8_;
    fence.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.m_allocator =
         (VkAllocationCallbacks *)preImageBarrier._24_8_;
    fence.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.object.m_internal =
         preImageBarrier._0_8_;
    fence.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.m_deviceIface =
         (DeviceInterface *)preImageBarrier.pNext;
    if (postImageBarrier._0_8_ != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)6>_>::operator()
                ((Deleter<vk::Handle<(vk::HandleType)6>_> *)&postImageBarrier.pNext,
                 (VkFence)postImageBarrier._0_8_);
    }
    preBufferBarrier.sType = VK_STRUCTURE_TYPE_BUFFER_MEMORY_BARRIER;
    preBufferBarrier.pNext = (void *)0x0;
    preBufferBarrier.srcAccessMask = 0x4000;
    preBufferBarrier.dstAccessMask = 0x800;
    preBufferBarrier.srcQueueFamilyIndex = 0xffffffff;
    preBufferBarrier.dstQueueFamilyIndex = 0xffffffff;
    preBufferBarrier.buffer.m_internal =
         buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal;
    preBufferBarrier.offset = 0;
    preImageBarrier.sType = VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER;
    preImageBarrier.pNext = (void *)0x0;
    preImageBarrier.srcAccessMask = 0;
    preImageBarrier.dstAccessMask = 0x1000;
    preImageBarrier.oldLayout = VK_IMAGE_LAYOUT_UNDEFINED;
    preImageBarrier.newLayout = VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL;
    preImageBarrier.srcQueueFamilyIndex = 0xffffffff;
    preImageBarrier.dstQueueFamilyIndex = 0xffffffff;
    preImageBarrier.subresourceRange.aspectMask = 1;
    preImageBarrier.subresourceRange.baseMipLevel = 0;
    preImageBarrier.subresourceRange.levelCount = 1;
    preImageBarrier.subresourceRange.baseArrayLayer = 0;
    preImageBarrier.subresourceRange.layerCount = 1;
    postImageBarrier.sType = VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER;
    postImageBarrier.pNext = (void *)0x0;
    postImageBarrier.srcAccessMask = 0x1000;
    postImageBarrier.dstAccessMask = 0x20;
    postImageBarrier.oldLayout = VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL;
    postImageBarrier.newLayout = VK_IMAGE_LAYOUT_SHADER_READ_ONLY_OPTIMAL;
    postImageBarrier.srcQueueFamilyIndex = 0xffffffff;
    postImageBarrier.dstQueueFamilyIndex = 0xffffffff;
    postImageBarrier.subresourceRange.aspectMask = 1;
    postImageBarrier.subresourceRange.baseMipLevel = 0;
    postImageBarrier.subresourceRange.levelCount = 1;
    postImageBarrier.subresourceRange.baseArrayLayer = 0;
    postImageBarrier.subresourceRange.layerCount = 1;
    cmdBufferBeginInfo.flags = 1;
    cmdBufferBeginInfo._20_4_ = 0;
    cmdBufferBeginInfo.pInheritanceInfo = (VkCommandBufferInheritanceInfo *)0x0;
    cmdBufferBeginInfo.sType = VK_STRUCTURE_TYPE_COMMAND_BUFFER_BEGIN_INFO;
    cmdBufferBeginInfo._4_4_ = 0;
    cmdBufferBeginInfo.pNext = (void *)0x0;
    copyRegions.bufferOffset = 0;
    copyRegions.bufferRowLength = local_88.super_ConstPixelBufferAccess.m_size.m_data[0];
    copyRegions.bufferImageHeight = local_88.super_ConstPixelBufferAccess.m_size.m_data[1];
    copyRegions.imageSubresource.aspectMask = 1;
    copyRegions.imageSubresource.mipLevel = 0;
    copyRegions.imageSubresource.baseArrayLayer = 0;
    copyRegions.imageSubresource.layerCount = 1;
    copyRegions.imageOffset.x = 0;
    copyRegions.imageOffset.y = 0;
    copyRegions.imageOffset.z = 0;
    copyRegions.imageExtent.width = local_88.super_ConstPixelBufferAccess.m_size.m_data[0];
    copyRegions.imageExtent.height = local_88.super_ConstPixelBufferAccess.m_size.m_data[1];
    copyRegions.imageExtent.depth = local_88.super_ConstPixelBufferAccess.m_size.m_data[2];
    postImageBarrier.image.m_internal = dVar4;
    preImageBarrier.image.m_internal = dVar4;
    preBufferBarrier.size = size;
    tcu::PixelBufferAccess::PixelBufferAccess
              (&destAccess,(TextureFormat *)&local_88,&local_88.super_ConstPixelBufferAccess.m_size,
               *(void **)((long)TVar6 + 0x18));
    tcu::copy((EVP_PKEY_CTX *)&destAccess,(EVP_PKEY_CTX *)&local_88);
    ::vk::flushMappedMemoryRange
              (pDVar23,device_00,(VkDeviceMemory)*(deUint64 *)((long)TVar6 + 8),
               *(VkDeviceSize *)((long)TVar6 + 0x10),size);
    VVar18 = (*pDVar23->_vptr_DeviceInterface[0x49])(pDVar23,TVar9,&cmdBufferBeginInfo);
    ::vk::checkResult(VVar18,"vk.beginCommandBuffer(*cmdBuffer, &cmdBufferBeginInfo)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/geometry/vktGeometryBasicGeometryShaderTests.cpp"
                      ,0xe8);
    (*pDVar23->_vptr_DeviceInterface[0x6d])
              (pDVar23,TVar9,1,0x1000,0,0,0,1,&preBufferBarrier,1,&preImageBarrier);
    (*pDVar23->_vptr_DeviceInterface[0x62])
              (pDVar23,TVar9,
               buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal,dVar4,7
               ,1,&copyRegions);
    (*pDVar23->_vptr_DeviceInterface[0x6d])
              (pDVar23,TVar9,0x1000,0x2000,0,0,0,0,0,1,&postImageBarrier);
    VVar18 = (*pDVar23->_vptr_DeviceInterface[0x4a])(pDVar23,TVar9);
    ::vk::checkResult(VVar18,"vk.endCommandBuffer(*cmdBuffer)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/geometry/vktGeometryBasicGeometryShaderTests.cpp"
                      ,0xec);
    destAccess.super_ConstPixelBufferAccess.m_size.m_data[0] = 0;
    destAccess.super_ConstPixelBufferAccess.m_size.m_data[1] = 0;
    destAccess.super_ConstPixelBufferAccess.m_data = (void *)0x0;
    destAccess.super_ConstPixelBufferAccess.m_size.m_data[2] = 0;
    destAccess.super_ConstPixelBufferAccess.m_pitch.m_data[0] = 0;
    destAccess.super_ConstPixelBufferAccess.m_pitch.m_data[1] = 0;
    destAccess.super_ConstPixelBufferAccess.m_pitch.m_data[2] = 0;
    destAccess.super_ConstPixelBufferAccess.m_format.order = LA;
    destAccess.super_ConstPixelBufferAccess.m_format.type = SNORM_INT8;
    VVar18 = (*pDVar23->_vptr_DeviceInterface[2])
                       (pDVar23,pVVar24,1,&destAccess,
                        fence.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.object.m_internal
                       );
    ::vk::checkResult(VVar18,"vk.queueSubmit(queue, 1, &submitInfo, *fence)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/geometry/vktGeometryBasicGeometryShaderTests.cpp"
                      ,0xfb);
    VVar18 = (*pDVar23->_vptr_DeviceInterface[0x16])
                       (pDVar23,device_00,1,&fence,1,0xffffffffffffffff);
    ::vk::checkResult(VVar18,"vk.waitForFences(device, 1, &fence.get(), true, ~(0ull) )",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/geometry/vktGeometryBasicGeometryShaderTests.cpp"
                      ,0xfc);
    if (fence.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.object.m_internal != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)6>_>::operator()
                (&fence.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter,
                 (VkFence)fence.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.object.
                          m_internal);
    }
    if (TVar9 != (TextureFormat)0x0) {
      preImageBarrier._0_8_ = uVar8;
      (**(code **)(*(long *)uVar11 + 0x240))(uVar11,uVar12,uVar13,1);
    }
    if (cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)24>_>::operator()
                (&cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter,
                 (VkCommandPool)
                 cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal);
    }
    if (TVar6 != (TextureFormat)0x0) {
      (**(code **)(*(long *)TVar6 + 8))(TVar6);
    }
    if (buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
                (&buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter,
                 (VkBuffer)
                 buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal);
    }
    ::vk::DescriptorSetLayoutBuilder::DescriptorSetLayoutBuilder
              ((DescriptorSetLayoutBuilder *)&preImageBarrier);
    pDVar20 = ::vk::DescriptorSetLayoutBuilder::addBinding
                        ((DescriptorSetLayoutBuilder *)&preImageBarrier,
                         VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER,1,8,(VkSampler *)0x0);
    ::vk::DescriptorSetLayoutBuilder::build
              ((Move<vk::Handle<(vk::HandleType)19>_> *)&destAccess,pDVar20,vk,device,0);
    postImageBarrier.srcAccessMask = destAccess.super_ConstPixelBufferAccess.m_size.m_data[2];
    postImageBarrier.dstAccessMask = destAccess.super_ConstPixelBufferAccess.m_pitch.m_data[0];
    postImageBarrier.oldLayout = destAccess.super_ConstPixelBufferAccess.m_pitch.m_data[1];
    postImageBarrier.newLayout = destAccess.super_ConstPixelBufferAccess.m_pitch.m_data[2];
    postImageBarrier.sType = destAccess.super_ConstPixelBufferAccess.m_format.order;
    postImageBarrier._4_4_ = destAccess.super_ConstPixelBufferAccess.m_format.type;
    postImageBarrier.pNext = (void *)destAccess.super_ConstPixelBufferAccess.m_size.m_data._0_8_;
    destAccess.super_ConstPixelBufferAccess.m_format.order = R;
    destAccess.super_ConstPixelBufferAccess.m_format.type = SNORM_INT8;
    destAccess.super_ConstPixelBufferAccess.m_size.m_data[0] = 0;
    destAccess.super_ConstPixelBufferAccess.m_size.m_data[1] = 0;
    destAccess.super_ConstPixelBufferAccess.m_size.m_data[2] = 0;
    destAccess.super_ConstPixelBufferAccess.m_pitch.m_data[0] = 0;
    destAccess.super_ConstPixelBufferAccess.m_pitch.m_data[1] = 0;
    destAccess.super_ConstPixelBufferAccess.m_pitch.m_data[2] = 0;
    VVar25.m_internal =
         (this->m_descriptorSetLayout).super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.object.
         m_internal;
    if (VVar25.m_internal != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)19>_>::operator()
                (&(this->m_descriptorSetLayout).super_RefBase<vk::Handle<(vk::HandleType)19>_>.
                  m_data.deleter,VVar25);
    }
    pMVar2 = &this->m_descriptorSetLayout;
    (this->m_descriptorSetLayout).super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.
    m_device = (VkDevice)postImageBarrier._16_8_;
    (this->m_descriptorSetLayout).super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.
    m_allocator = (VkAllocationCallbacks *)postImageBarrier._24_8_;
    (pMVar2->super_RefBase<vk::Handle<(vk::HandleType)19>_>).m_data.object.m_internal =
         postImageBarrier._0_8_;
    (this->m_descriptorSetLayout).super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.
    m_deviceIface = (DeviceInterface *)postImageBarrier.pNext;
    if (destAccess.super_ConstPixelBufferAccess.m_format != (TextureFormat)0x0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)19>_>::operator()
                ((Deleter<vk::Handle<(vk::HandleType)19>_> *)
                 &destAccess.super_ConstPixelBufferAccess.m_size,
                 (VkDescriptorSetLayout)destAccess.super_ConstPixelBufferAccess.m_format);
    }
    destAccess.super_ConstPixelBufferAccess.m_size.m_data[2] = 0;
    destAccess.super_ConstPixelBufferAccess.m_pitch.m_data[0] = 0;
    destAccess.super_ConstPixelBufferAccess.m_pitch.m_data[1] = 0;
    destAccess.super_ConstPixelBufferAccess.m_pitch.m_data[2] = 0;
    destAccess.super_ConstPixelBufferAccess.m_format.order = R;
    destAccess.super_ConstPixelBufferAccess.m_format.type = SNORM_INT8;
    destAccess.super_ConstPixelBufferAccess.m_size.m_data[0] = 0;
    destAccess.super_ConstPixelBufferAccess.m_size.m_data[1] = 0;
    if (preImageBarrier.subresourceRange._0_8_ != 0) {
      operator_delete((void *)preImageBarrier.subresourceRange._0_8_,
                      CONCAT44(preImageBarrier._68_4_,preImageBarrier.subresourceRange.layerCount) -
                      preImageBarrier.subresourceRange._0_8_);
    }
    if (preImageBarrier._24_8_ != 0) {
      operator_delete((void *)preImageBarrier._24_8_,
                      preImageBarrier.image.m_internal - preImageBarrier._24_8_);
    }
    if (preImageBarrier._0_8_ != 0) {
      operator_delete((void *)preImageBarrier._0_8_,preImageBarrier._16_8_ - preImageBarrier._0_8_);
    }
    ::vk::DescriptorPoolBuilder::DescriptorPoolBuilder((DescriptorPoolBuilder *)&destAccess);
    pDVar21 = ::vk::DescriptorPoolBuilder::addType
                        ((DescriptorPoolBuilder *)&destAccess,
                         VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER,1);
    ::vk::DescriptorPoolBuilder::build
              ((Move<vk::Handle<(vk::HandleType)21>_> *)&postImageBarrier,pDVar21,vk,device,1,1);
    preImageBarrier.srcAccessMask = postImageBarrier.srcAccessMask;
    preImageBarrier.dstAccessMask = postImageBarrier.dstAccessMask;
    preImageBarrier.oldLayout = postImageBarrier.oldLayout;
    preImageBarrier.newLayout = postImageBarrier.newLayout;
    preImageBarrier.sType = postImageBarrier.sType;
    preImageBarrier._4_4_ = postImageBarrier._4_4_;
    preImageBarrier.pNext = postImageBarrier.pNext;
    postImageBarrier.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
    postImageBarrier._4_4_ = 0;
    postImageBarrier.pNext = (void *)0x0;
    postImageBarrier.srcAccessMask = 0;
    postImageBarrier.dstAccessMask = 0;
    postImageBarrier.oldLayout = VK_IMAGE_LAYOUT_UNDEFINED;
    postImageBarrier.newLayout = VK_IMAGE_LAYOUT_UNDEFINED;
    VVar3.m_internal =
         (this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.object.
         m_internal;
    if (VVar3.m_internal != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)21>_>::operator()
                (&(this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.
                  deleter,VVar3);
    }
    (this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_device
         = (VkDevice)preImageBarrier._16_8_;
    (this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.
    m_allocator = (VkAllocationCallbacks *)preImageBarrier._24_8_;
    (this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.object.m_internal
         = preImageBarrier._0_8_;
    (this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.
    m_deviceIface = (DeviceInterface *)preImageBarrier.pNext;
    if (postImageBarrier._0_8_ != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)21>_>::operator()
                ((Deleter<vk::Handle<(vk::HandleType)21>_> *)&postImageBarrier.pNext,
                 (VkDescriptorPool)postImageBarrier._0_8_);
    }
    postImageBarrier.srcAccessMask = 0;
    postImageBarrier.dstAccessMask = 0;
    postImageBarrier.oldLayout = VK_IMAGE_LAYOUT_UNDEFINED;
    postImageBarrier.newLayout = VK_IMAGE_LAYOUT_UNDEFINED;
    postImageBarrier.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
    postImageBarrier._4_4_ = 0;
    postImageBarrier.pNext = (void *)0x0;
    if (destAccess.super_ConstPixelBufferAccess.m_format != (TextureFormat)0x0) {
      operator_delete((void *)destAccess.super_ConstPixelBufferAccess.m_format,
                      destAccess.super_ConstPixelBufferAccess._16_8_ -
                      (long)destAccess.super_ConstPixelBufferAccess.m_format);
    }
    makeDescriptorSet((Move<vk::Handle<(vk::HandleType)22>_> *)&postImageBarrier,vk,device,
                      (VkDescriptorPool)
                      (this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data
                      .object.m_internal,
                      (VkDescriptorSetLayout)
                      (pMVar2->super_RefBase<vk::Handle<(vk::HandleType)19>_>).m_data.object.
                      m_internal);
    preImageBarrier.srcAccessMask = postImageBarrier.srcAccessMask;
    preImageBarrier.dstAccessMask = postImageBarrier.dstAccessMask;
    preImageBarrier.oldLayout = postImageBarrier.oldLayout;
    preImageBarrier.newLayout = postImageBarrier.newLayout;
    preImageBarrier.sType = postImageBarrier.sType;
    preImageBarrier._4_4_ = postImageBarrier._4_4_;
    preImageBarrier.pNext = postImageBarrier.pNext;
    postImageBarrier.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
    postImageBarrier._4_4_ = 0;
    postImageBarrier.pNext = (void *)0x0;
    postImageBarrier.srcAccessMask = 0;
    postImageBarrier.dstAccessMask = 0;
    postImageBarrier.oldLayout = VK_IMAGE_LAYOUT_UNDEFINED;
    postImageBarrier.newLayout = VK_IMAGE_LAYOUT_UNDEFINED;
    TVar6 = (TextureFormat)
            (this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.object.
            m_internal;
    if (TVar6 != (TextureFormat)0x0) {
      pDVar23 = (this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.
                deleter.m_deviceIface;
      destAccess.super_ConstPixelBufferAccess.m_format = TVar6;
      (*pDVar23->_vptr_DeviceInterface[0x3d])
                (pDVar23,(this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.
                         m_data.deleter.m_device,
                 (this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.
                 deleter.m_pool.m_internal,1);
    }
    *(VkAccessFlags *)
     &(this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_device
         = preImageBarrier.srcAccessMask;
    *(VkAccessFlags *)
     ((long)&(this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.
             m_device + 4) = preImageBarrier.dstAccessMask;
    *(VkImageLayout *)
     &(this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_pool.
      m_internal = preImageBarrier.oldLayout;
    *(VkImageLayout *)
     ((long)&(this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.
             m_pool.m_internal + 4) = preImageBarrier.newLayout;
    *(VkStructureType *)
     &(this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.object.
      m_internal = preImageBarrier.sType;
    *(undefined4 *)
     ((long)&(this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.object.
             m_internal + 4) = preImageBarrier._4_4_;
    *(undefined4 *)
     &(this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.
      m_deviceIface = preImageBarrier.pNext._0_4_;
    *(undefined4 *)
     ((long)&(this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.
             m_deviceIface + 4) = preImageBarrier.pNext._4_4_;
    if (postImageBarrier._0_8_ != 0) {
      preImageBarrier.sType = postImageBarrier.sType;
      preImageBarrier._4_4_ = postImageBarrier._4_4_;
      (**(code **)(*postImageBarrier.pNext + 0x1e8))
                (postImageBarrier.pNext,postImageBarrier._16_8_,postImageBarrier._24_8_,1);
    }
    makePipelineLayout(__return_storage_ptr__,vk,device,
                       (VkDescriptorSetLayout)
                       (pMVar2->super_RefBase<vk::Handle<(vk::HandleType)19>_>).m_data.object.
                       m_internal);
    tcu::TextureLevel::~TextureLevel(&texture);
  }
  else {
    if (this->m_test == READ_UNIFORM) {
      ::vk::DescriptorSetLayoutBuilder::DescriptorSetLayoutBuilder
                ((DescriptorSetLayoutBuilder *)&imageParams);
      pDVar20 = ::vk::DescriptorSetLayoutBuilder::addBinding
                          ((DescriptorSetLayoutBuilder *)&imageParams,
                           VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER,1,8,(VkSampler *)0x0);
      ::vk::DescriptorSetLayoutBuilder::build
                ((Move<vk::Handle<(vk::HandleType)19>_> *)&postImageBarrier,pDVar20,vk,device,0);
      preImageBarrier.srcAccessMask = postImageBarrier.srcAccessMask;
      preImageBarrier.dstAccessMask = postImageBarrier.dstAccessMask;
      preImageBarrier.oldLayout = postImageBarrier.oldLayout;
      preImageBarrier.newLayout = postImageBarrier.newLayout;
      preImageBarrier.sType = postImageBarrier.sType;
      preImageBarrier._4_4_ = postImageBarrier._4_4_;
      preImageBarrier.pNext = postImageBarrier.pNext;
      postImageBarrier.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
      postImageBarrier._4_4_ = 0;
      postImageBarrier.pNext = (void *)0x0;
      postImageBarrier.srcAccessMask = 0;
      postImageBarrier.dstAccessMask = 0;
      postImageBarrier.oldLayout = VK_IMAGE_LAYOUT_UNDEFINED;
      postImageBarrier.newLayout = VK_IMAGE_LAYOUT_UNDEFINED;
      VVar25.m_internal =
           (this->m_descriptorSetLayout).super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.
           object.m_internal;
      if (VVar25.m_internal != 0) {
        ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)19>_>::operator()
                  (&(this->m_descriptorSetLayout).super_RefBase<vk::Handle<(vk::HandleType)19>_>.
                    m_data.deleter,VVar25);
      }
      (this->m_descriptorSetLayout).super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.
      m_device = (VkDevice)preImageBarrier._16_8_;
      (this->m_descriptorSetLayout).super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.
      m_allocator = (VkAllocationCallbacks *)preImageBarrier._24_8_;
      (this->m_descriptorSetLayout).super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.object.
      m_internal = preImageBarrier._0_8_;
      (this->m_descriptorSetLayout).super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.
      m_deviceIface = (DeviceInterface *)preImageBarrier.pNext;
      if (postImageBarrier._0_8_ != 0) {
        ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)19>_>::operator()
                  ((Deleter<vk::Handle<(vk::HandleType)19>_> *)&postImageBarrier.pNext,
                   (VkDescriptorSetLayout)postImageBarrier._0_8_);
      }
      postImageBarrier.srcAccessMask = 0;
      postImageBarrier.dstAccessMask = 0;
      postImageBarrier.oldLayout = VK_IMAGE_LAYOUT_UNDEFINED;
      postImageBarrier.newLayout = VK_IMAGE_LAYOUT_UNDEFINED;
      postImageBarrier.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
      postImageBarrier._4_4_ = 0;
      postImageBarrier.pNext = (void *)0x0;
      pvVar7 = (void *)CONCAT44(imageParams.tiling,imageParams.samples);
      if (pvVar7 != (void *)0x0) {
        operator_delete(pvVar7,CONCAT44(imageParams._68_4_,imageParams.queueFamilyIndexCount) -
                               (long)pvVar7);
      }
      pvVar7 = (void *)CONCAT44(imageParams.extent.width,imageParams.format);
      if (pvVar7 != (void *)0x0) {
        operator_delete(pvVar7,CONCAT44(imageParams.arrayLayers,imageParams.mipLevels) -
                               (long)pvVar7);
      }
      if (imageParams._0_8_ != 0) {
        operator_delete((void *)imageParams._0_8_,imageParams._16_8_ - imageParams._0_8_);
      }
      ::vk::DescriptorPoolBuilder::DescriptorPoolBuilder((DescriptorPoolBuilder *)&postImageBarrier)
      ;
      pDVar21 = ::vk::DescriptorPoolBuilder::addType
                          ((DescriptorPoolBuilder *)&postImageBarrier,
                           VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER,1);
      ::vk::DescriptorPoolBuilder::build
                ((Move<vk::Handle<(vk::HandleType)21>_> *)&preImageBarrier,pDVar21,vk,device,1,1);
      imageParams.flags = preImageBarrier.srcAccessMask;
      imageParams.imageType = preImageBarrier.dstAccessMask;
      imageParams.format = preImageBarrier.oldLayout;
      imageParams.extent.width = preImageBarrier.newLayout;
      imageParams.sType = preImageBarrier.sType;
      imageParams._4_4_ = preImageBarrier._4_4_;
      imageParams.pNext = preImageBarrier.pNext;
      preImageBarrier.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
      preImageBarrier._4_4_ = 0;
      preImageBarrier.pNext = (void *)0x0;
      preImageBarrier.srcAccessMask = 0;
      preImageBarrier.dstAccessMask = 0;
      preImageBarrier.oldLayout = VK_IMAGE_LAYOUT_UNDEFINED;
      preImageBarrier.newLayout = VK_IMAGE_LAYOUT_UNDEFINED;
      VVar3.m_internal =
           (this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.object.
           m_internal;
      if (VVar3.m_internal != 0) {
        ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)21>_>::operator()
                  (&(this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.
                    deleter,VVar3);
      }
      (this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.
      m_device = (VkDevice)imageParams._16_8_;
      (this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.
      m_allocator = (VkAllocationCallbacks *)CONCAT44(imageParams.extent.width,imageParams.format);
      (this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.object.
      m_internal = imageParams._0_8_;
      (this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.
      m_deviceIface = (DeviceInterface *)imageParams.pNext;
      if (preImageBarrier._0_8_ != 0) {
        ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)21>_>::operator()
                  ((Deleter<vk::Handle<(vk::HandleType)21>_> *)&preImageBarrier.pNext,
                   (VkDescriptorPool)preImageBarrier._0_8_);
      }
      preImageBarrier.srcAccessMask = 0;
      preImageBarrier.dstAccessMask = 0;
      preImageBarrier.oldLayout = VK_IMAGE_LAYOUT_UNDEFINED;
      preImageBarrier.newLayout = VK_IMAGE_LAYOUT_UNDEFINED;
      preImageBarrier.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
      preImageBarrier._4_4_ = 0;
      preImageBarrier.pNext = (void *)0x0;
      if (postImageBarrier._0_8_ != 0) {
        operator_delete((void *)postImageBarrier._0_8_,
                        postImageBarrier._16_8_ - postImageBarrier._0_8_);
      }
      makeDescriptorSet((Move<vk::Handle<(vk::HandleType)22>_> *)&preImageBarrier,vk,device,
                        (VkDescriptorPool)
                        (this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.
                        m_data.object.m_internal,
                        (VkDescriptorSetLayout)
                        (this->m_descriptorSetLayout).super_RefBase<vk::Handle<(vk::HandleType)19>_>
                        .m_data.object.m_internal);
      imageParams.flags = preImageBarrier.srcAccessMask;
      imageParams.imageType = preImageBarrier.dstAccessMask;
      imageParams.format = preImageBarrier.oldLayout;
      imageParams.extent.width = preImageBarrier.newLayout;
      imageParams.sType = preImageBarrier.sType;
      imageParams._4_4_ = preImageBarrier._4_4_;
      imageParams.pNext = preImageBarrier.pNext;
      preImageBarrier.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
      preImageBarrier._4_4_ = 0;
      preImageBarrier.pNext = (void *)0x0;
      preImageBarrier.srcAccessMask = 0;
      preImageBarrier.dstAccessMask = 0;
      preImageBarrier.oldLayout = VK_IMAGE_LAYOUT_UNDEFINED;
      preImageBarrier.newLayout = VK_IMAGE_LAYOUT_UNDEFINED;
      dVar4 = (this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.object.
              m_internal;
      if (dVar4 != 0) {
        pDVar23 = (this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.
                  deleter.m_deviceIface;
        postImageBarrier._0_8_ = dVar4;
        (*pDVar23->_vptr_DeviceInterface[0x3d])
                  (pDVar23,(this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.
                           m_data.deleter.m_device,
                   (this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.
                   deleter.m_pool.m_internal,1);
      }
      *(VkImageCreateFlags *)
       &(this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.
        m_device = imageParams.flags;
      *(VkImageType *)
       ((long)&(this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter
               .m_device + 4) = imageParams.imageType;
      *(VkFormat *)
       &(this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_pool
        .m_internal = imageParams.format;
      *(deUint32 *)
       ((long)&(this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter
               .m_pool.m_internal + 4) = imageParams.extent.width;
      *(VkStructureType *)
       &(this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.object.
        m_internal = imageParams.sType;
      *(undefined4 *)
       ((long)&(this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.object.
               m_internal + 4) = imageParams._4_4_;
      *(undefined4 *)
       &(this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.
        m_deviceIface = imageParams.pNext._0_4_;
      *(undefined4 *)
       ((long)&(this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter
               .m_deviceIface + 4) = imageParams.pNext._4_4_;
      if (preImageBarrier._0_8_ != 0) {
        imageParams.sType = preImageBarrier.sType;
        imageParams._4_4_ = preImageBarrier._4_4_;
        (**(code **)(*preImageBarrier.pNext + 0x1e8))
                  (preImageBarrier.pNext,preImageBarrier._16_8_,preImageBarrier._24_8_,1);
      }
      VVar25.m_internal =
           (this->m_descriptorSetLayout).super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.
           object.m_internal;
    }
    else {
      VVar25.m_internal = 0;
    }
    makePipelineLayout(__return_storage_ptr__,vk,device,VVar25);
  }
  return __return_storage_ptr__;
}

Assistant:

Move<VkPipelineLayout> VaryingOutputCountTestInstance::createPipelineLayout (const DeviceInterface& vk, const VkDevice device)
{
	if (m_test == READ_UNIFORM)
	{
		m_descriptorSetLayout	=	DescriptorSetLayoutBuilder()
									.addSingleBinding(VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER, VK_SHADER_STAGE_GEOMETRY_BIT)
									.build(vk, device);
		m_descriptorPool		=	DescriptorPoolBuilder()
									.addType(VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER)
									.build(vk, device, VK_DESCRIPTOR_POOL_CREATE_FREE_DESCRIPTOR_SET_BIT, 1u);
		m_descriptorSet			=	makeDescriptorSet(vk, device, *m_descriptorPool, *m_descriptorSetLayout);

		return makePipelineLayout(vk, device, *m_descriptorSetLayout);
	}
	else if (m_test == READ_TEXTURE)
	{
		const tcu::Vec4				data[4]				=
														{
															tcu::Vec4(255, 0, 0, 0),
															tcu::Vec4(0, 255, 0, 0),
															tcu::Vec4(0, 0, 255, 0),
															tcu::Vec4(0, 0, 0, 255)
														};
		const tcu::UVec2			viewportSize		(4, 1);
		const tcu::TextureFormat	texFormat			= glu::mapGLInternalFormat(GL_RGBA8);
		const VkFormat				format				= mapTextureFormat(texFormat);
		const VkImageUsageFlags		imageUsageFlags		= VK_IMAGE_USAGE_SAMPLED_BIT | VK_IMAGE_USAGE_TRANSFER_DST_BIT;
		Allocator&					memAlloc			= m_context.getDefaultAllocator();
		tcu::TextureLevel			texture				(texFormat, static_cast<int>(viewportSize.x()), static_cast<int>(viewportSize.y()));

		// Fill with data
		{
			tcu::PixelBufferAccess access = texture.getAccess();
			for (int x = 0; x < texture.getWidth(); ++x)
				access.setPixel(data[x], x, 0);
		}
		// Create image
		const VkImageCreateInfo			imageParams =
		{
			VK_STRUCTURE_TYPE_IMAGE_CREATE_INFO,	// VkStructureType			sType;
			DE_NULL,								// const void*				pNext;
			0,										// VkImageCreateFlags		flags;
			VK_IMAGE_TYPE_2D,						// VkImageType				imageType;
			format,									// VkFormat					format;
			{										// VkExtent3D				extent;
					viewportSize.x(),
					viewportSize.y(),
					1u,
			},
			1u,							// deUint32					mipLevels;
			1u,							// deUint32					arrayLayers;
			VK_SAMPLE_COUNT_1_BIT,		// VkSampleCountFlagBits	samples;
			VK_IMAGE_TILING_OPTIMAL,	// VkImageTiling			tiling;
			imageUsageFlags,			// VkImageUsageFlags		usage;
			VK_SHARING_MODE_EXCLUSIVE,	// VkSharingMode			sharingMode;
			0u,							// deUint32					queueFamilyIndexCount;
			DE_NULL,					// const deUint32*			pQueueFamilyIndices;
			VK_IMAGE_LAYOUT_UNDEFINED	// VkImageLayout			initialLayout;
		};

		m_texture		= createImage(vk, device, &imageParams);
		m_allocation	= memAlloc.allocate(getImageMemoryRequirements(vk, device, *m_texture), MemoryRequirement::Any);
		VK_CHECK(vk.bindImageMemory(device, *m_texture, m_allocation->getMemory(), m_allocation->getOffset()));
		uploadImage(m_context, texture.getAccess(), *m_texture);

		m_descriptorSetLayout	=	DescriptorSetLayoutBuilder()
									.addSingleBinding(VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER, VK_SHADER_STAGE_GEOMETRY_BIT)
									.build(vk, device);
		m_descriptorPool		=	DescriptorPoolBuilder()
									.addType(VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER)
									.build(vk, device, VK_DESCRIPTOR_POOL_CREATE_FREE_DESCRIPTOR_SET_BIT, 1u);
		m_descriptorSet			=	makeDescriptorSet(vk, device, *m_descriptorPool, *m_descriptorSetLayout);

		return makePipelineLayout(vk, device, *m_descriptorSetLayout);
	}
	else
		return makePipelineLayout(vk, device);
}